

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O1

void soplex::
     SPxQuicksort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
               (IdxElement *keys,int end,IdxCompare *compare,int start,bool type)

{
  IdxElement *pIVar1;
  IdxElement *pIVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  fpclass_type fVar6;
  int32_t iVar7;
  int iVar8;
  int32_t iVar9;
  fpclass_type fVar10;
  int32_t iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  IdxElement *pIVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  fpclass_type *pfVar19;
  ulong uVar20;
  cpp_dec_float<200U,_int,_void> *pcVar21;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar22;
  uint *puVar23;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar24;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar25;
  uint uVar26;
  uint uVar27;
  long lVar28;
  byte bVar29;
  type t;
  cpp_dec_float<200U,_int,_void> local_848;
  uint local_7c8 [30];
  uint local_750 [28];
  IdxElement local_6e0;
  IdxElement local_65c;
  IdxElement local_5d8;
  IdxElement local_554;
  IdxElement local_4d0;
  IdxElement local_44c;
  cpp_dec_float<200U,_int,_void> local_3c8;
  IdxElement local_348;
  IdxElement local_2c4;
  IdxElement local_240;
  IdxElement local_1bc;
  IdxElement local_138;
  IdxElement local_b4;
  
  bVar29 = 0;
  if (start + 1 < end) {
    uVar26 = end - 1;
    uVar12 = uVar26 - start;
    if (0x18 < (int)uVar12) {
LAB_005abfd5:
      local_7c8[0x18] = 0;
      local_7c8[0x19] = 0;
      local_7c8[0x1a] = 0;
      local_7c8[0x1b] = 0;
      local_7c8[0x14] = 0;
      local_7c8[0x15] = 0;
      local_7c8[0x16] = 0;
      local_7c8[0x17] = 0;
      local_7c8[0x10] = 0;
      local_7c8[0x11] = 0;
      local_7c8[0x12] = 0;
      local_7c8[0x13] = 0;
      local_7c8[0xc] = 0;
      local_7c8[0xd] = 0;
      local_7c8[0xe] = 0;
      local_7c8[0xf] = 0;
      local_7c8[8] = 0;
      local_7c8[9] = 0;
      local_7c8[10] = 0;
      local_7c8[0xb] = 0;
      local_7c8[4] = 0;
      local_7c8[5] = 0;
      local_7c8[6] = 0;
      local_7c8[7] = 0;
      local_7c8[0] = 0;
      local_7c8[1] = 0;
      local_7c8[2] = 0;
      local_7c8[3] = 0;
      iVar13 = (uVar12 >> 1) + start;
      pIVar1 = keys + iVar13;
      pnVar25 = &keys[iVar13].val;
      iVar13 = *(int *)((long)(pnVar25 + -1) + 0x7c);
      pnVar22 = pnVar25;
      puVar23 = local_750;
      for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
        *puVar23 = (pnVar22->m_backend).data._M_elems[0];
        pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar22 + ((ulong)bVar29 * -2 + 1) * 4);
        puVar23 = puVar23 + (ulong)bVar29 * -2 + 1;
      }
      iVar5 = (pnVar25->m_backend).exp;
      bVar3 = (pnVar25->m_backend).neg;
      fVar6 = (pnVar25->m_backend).fpclass;
      iVar7 = (pnVar25->m_backend).prec_elem;
      lVar16 = (long)start;
      uVar12 = uVar26;
      uVar18 = start;
      do {
        uVar20 = (ulong)uVar12;
        if ((type & 1U) == 0) {
          if ((int)uVar18 < (int)uVar26) {
            pfVar19 = &keys[(int)uVar18].val.m_backend.fpclass;
            do {
              local_1bc.idx = pfVar19[-0x1f];
              pcVar21 = (cpp_dec_float<200U,_int,_void> *)(pfVar19 + -0x1e);
              pnVar22 = &local_1bc.val;
              for (lVar28 = 0x1c; lVar28 != 0; lVar28 = lVar28 + -1) {
                (pnVar22->m_backend).data._M_elems[0] = (pcVar21->data)._M_elems[0];
                pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar29 * -8 + 4)
                ;
                pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar22 + ((ulong)bVar29 * -2 + 1) * 4);
              }
              local_1bc.val.m_backend.exp = pfVar19[-2];
              local_1bc.val.m_backend.neg = *(bool *)(pfVar19 + -1);
              local_1bc.val.m_backend._120_8_ = *(undefined8 *)pfVar19;
              local_554.idx = iVar13;
              puVar23 = local_750;
              pnVar22 = &local_554.val;
              for (lVar28 = 0x1c; lVar28 != 0; lVar28 = lVar28 + -1) {
                (pnVar22->m_backend).data._M_elems[0] = *puVar23;
                puVar23 = puVar23 + (ulong)bVar29 * -2 + 1;
                pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar22 + ((ulong)bVar29 * -2 + 1) * 4);
              }
              local_554.val.m_backend.exp = iVar5;
              local_554.val.m_backend.neg = bVar3;
              local_554.val.m_backend.fpclass = fVar6;
              local_554.val.m_backend.prec_elem = iVar7;
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_848,compare,&local_1bc,&local_554);
              if (local_848.fpclass == cpp_dec_float_NaN) break;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_3c8,0,(type *)0x0);
              iVar14 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&local_848,&local_3c8);
              if (0 < iVar14) break;
              uVar18 = uVar18 + 1;
              pfVar19 = pfVar19 + 0x21;
            } while (uVar26 != uVar18);
          }
          if (start < (int)uVar12) {
            uVar20 = (ulong)(int)uVar12;
            pfVar19 = &keys[uVar20].val.m_backend.fpclass;
            do {
              local_240.idx = pfVar19[-0x1f];
              pcVar21 = (cpp_dec_float<200U,_int,_void> *)(pfVar19 + -0x1e);
              pnVar22 = &local_240.val;
              for (lVar28 = 0x1c; lVar28 != 0; lVar28 = lVar28 + -1) {
                (pnVar22->m_backend).data._M_elems[0] = (pcVar21->data)._M_elems[0];
                pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar29 * -8 + 4)
                ;
                pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar22 + ((ulong)bVar29 * -2 + 1) * 4);
              }
              local_240.val.m_backend.exp = pfVar19[-2];
              local_240.val.m_backend.neg = *(bool *)(pfVar19 + -1);
              local_240.val.m_backend._120_8_ = *(undefined8 *)pfVar19;
              local_5d8.idx = iVar13;
              puVar23 = local_750;
              pnVar22 = &local_5d8.val;
              for (lVar28 = 0x1c; lVar28 != 0; lVar28 = lVar28 + -1) {
                (pnVar22->m_backend).data._M_elems[0] = *puVar23;
                puVar23 = puVar23 + (ulong)bVar29 * -2 + 1;
                pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar22 + ((ulong)bVar29 * -2 + 1) * 4);
              }
              local_5d8.val.m_backend.exp = iVar5;
              local_5d8.val.m_backend.neg = bVar3;
              local_5d8.val.m_backend.fpclass = fVar6;
              local_5d8.val.m_backend.prec_elem = iVar7;
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_848,compare,&local_240,&local_5d8);
              if (local_848.fpclass == cpp_dec_float_NaN) break;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_3c8,0,(type *)0x0);
              iVar14 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&local_848,&local_3c8);
              if (iVar14 < 1) break;
              uVar20 = uVar20 - 1;
              pfVar19 = pfVar19 + -0x21;
            } while (lVar16 < (long)uVar20);
          }
        }
        else {
          if ((int)uVar18 < (int)uVar26) {
            pfVar19 = &keys[(int)uVar18].val.m_backend.fpclass;
            lVar28 = 0;
            do {
              local_b4.idx = pfVar19[-0x1f];
              pcVar21 = (cpp_dec_float<200U,_int,_void> *)(pfVar19 + -0x1e);
              pnVar22 = &local_b4.val;
              for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
                (pnVar22->m_backend).data._M_elems[0] = (pcVar21->data)._M_elems[0];
                pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar29 * -8 + 4)
                ;
                pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar22 + ((ulong)bVar29 * -2 + 1) * 4);
              }
              local_b4.val.m_backend.exp = pfVar19[-2];
              local_b4.val.m_backend.neg = *(bool *)(pfVar19 + -1);
              local_b4.val.m_backend._120_8_ = *(undefined8 *)pfVar19;
              local_44c.idx = iVar13;
              puVar23 = local_750;
              pnVar22 = &local_44c.val;
              for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
                (pnVar22->m_backend).data._M_elems[0] = *puVar23;
                puVar23 = puVar23 + (ulong)bVar29 * -2 + 1;
                pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar22 + ((ulong)bVar29 * -2 + 1) * 4);
              }
              local_44c.val.m_backend.exp = iVar5;
              local_44c.val.m_backend.neg = bVar3;
              local_44c.val.m_backend.fpclass = fVar6;
              local_44c.val.m_backend.prec_elem = iVar7;
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_848,compare,&local_b4,&local_44c);
              if (local_848.fpclass == cpp_dec_float_NaN) break;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_3c8,0,(type *)0x0);
              iVar14 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&local_848,&local_3c8);
              if (-1 < iVar14) {
                uVar18 = uVar18 - (int)lVar28;
                goto LAB_005ac307;
              }
              lVar28 = lVar28 + -1;
              pfVar19 = pfVar19 + 0x21;
            } while ((long)(int)uVar18 - (long)(int)uVar26 != lVar28);
            uVar18 = uVar18 - (int)lVar28;
          }
LAB_005ac307:
          if (start < (int)uVar12) {
            uVar20 = (ulong)(int)uVar12;
            pfVar19 = &keys[uVar20].val.m_backend.fpclass;
            do {
              local_138.idx = pfVar19[-0x1f];
              pcVar21 = (cpp_dec_float<200U,_int,_void> *)(pfVar19 + -0x1e);
              pnVar22 = &local_138.val;
              for (lVar28 = 0x1c; lVar28 != 0; lVar28 = lVar28 + -1) {
                (pnVar22->m_backend).data._M_elems[0] = (pcVar21->data)._M_elems[0];
                pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar29 * -8 + 4)
                ;
                pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar22 + ((ulong)bVar29 * -2 + 1) * 4);
              }
              local_138.val.m_backend.exp = pfVar19[-2];
              local_138.val.m_backend.neg = *(bool *)(pfVar19 + -1);
              local_138.val.m_backend._120_8_ = *(undefined8 *)pfVar19;
              local_4d0.idx = iVar13;
              puVar23 = local_750;
              pnVar22 = &local_4d0.val;
              for (lVar28 = 0x1c; lVar28 != 0; lVar28 = lVar28 + -1) {
                (pnVar22->m_backend).data._M_elems[0] = *puVar23;
                puVar23 = puVar23 + (ulong)bVar29 * -2 + 1;
                pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar22 + ((ulong)bVar29 * -2 + 1) * 4);
              }
              local_4d0.val.m_backend.exp = iVar5;
              local_4d0.val.m_backend.neg = bVar3;
              local_4d0.val.m_backend.fpclass = fVar6;
              local_4d0.val.m_backend.prec_elem = iVar7;
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_848,compare,&local_138,&local_4d0);
              if (local_848.fpclass == cpp_dec_float_NaN) break;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_3c8,0,(type *)0x0);
              iVar14 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&local_848,&local_3c8);
              if (iVar14 < 0) break;
              uVar20 = uVar20 - 1;
              pfVar19 = pfVar19 + -0x21;
            } while (lVar16 < (long)uVar20);
          }
        }
        uVar12 = (uint)uVar20;
        if ((int)uVar12 <= (int)uVar18) goto LAB_005ac5ec;
        pIVar15 = keys + (int)uVar18;
        iVar14 = pIVar15->idx;
        pnVar22 = &pIVar15->val;
        puVar23 = local_7c8;
        for (lVar28 = 0x1c; lVar28 != 0; lVar28 = lVar28 + -1) {
          *puVar23 = (pnVar22->m_backend).data._M_elems[0];
          pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar22 + (ulong)bVar29 * -8 + 4);
          puVar23 = puVar23 + (ulong)bVar29 * -2 + 1;
        }
        iVar8 = (pIVar15->val).m_backend.exp;
        bVar4 = (pIVar15->val).m_backend.neg;
        pIVar2 = keys + (int)uVar12;
        pIVar15->idx = pIVar2->idx;
        pnVar22 = &pIVar2->val;
        pnVar24 = &pIVar15->val;
        for (lVar28 = 0x1c; lVar28 != 0; lVar28 = lVar28 + -1) {
          (pnVar24->m_backend).data._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
          pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar22 + (ulong)bVar29 * -8 + 4);
          pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar24 + (ulong)bVar29 * -8 + 4);
        }
        (pIVar15->val).m_backend.exp = (pIVar2->val).m_backend.exp;
        (pIVar15->val).m_backend.neg = (pIVar2->val).m_backend.neg;
        pIVar2->idx = iVar14;
        puVar23 = local_7c8;
        pnVar22 = &pIVar2->val;
        for (lVar28 = 0x1c; lVar28 != 0; lVar28 = lVar28 + -1) {
          (pnVar22->m_backend).data._M_elems[0] = *puVar23;
          puVar23 = puVar23 + (ulong)bVar29 * -2 + 1;
          pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar22 + (ulong)bVar29 * -8 + 4);
        }
        (pIVar2->val).m_backend.exp = iVar8;
        (pIVar2->val).m_backend.neg = bVar4;
        fVar10 = (pIVar15->val).m_backend.fpclass;
        iVar11 = (pIVar15->val).m_backend.prec_elem;
        iVar9 = (pIVar2->val).m_backend.prec_elem;
        (pIVar15->val).m_backend.fpclass = (pIVar2->val).m_backend.fpclass;
        (pIVar15->val).m_backend.prec_elem = iVar9;
        (pIVar2->val).m_backend.fpclass = fVar10;
        (pIVar2->val).m_backend.prec_elem = iVar11;
        uVar18 = uVar18 + 1;
        uVar12 = uVar12 - 1;
      } while( true );
    }
LAB_005ac9dc:
    if (0 < (int)uVar12) {
      SPxShellsort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                (keys,uVar26,compare,start);
    }
  }
  return;
LAB_005ac5ec:
  if ((type & 1U) == 0) {
    if (start < (int)uVar12) {
      uVar20 = (ulong)(int)uVar12;
      pfVar19 = &keys[uVar20].val.m_backend.fpclass;
      do {
        local_6e0.idx = iVar13;
        puVar23 = local_750;
        pnVar22 = &local_6e0.val;
        for (lVar28 = 0x1c; lVar28 != 0; lVar28 = lVar28 + -1) {
          (pnVar22->m_backend).data._M_elems[0] = *puVar23;
          puVar23 = puVar23 + (ulong)bVar29 * -2 + 1;
          pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar22 + ((ulong)bVar29 * -2 + 1) * 4);
        }
        local_348.idx = pfVar19[-0x1f];
        pcVar21 = (cpp_dec_float<200U,_int,_void> *)(pfVar19 + -0x1e);
        pnVar22 = &local_348.val;
        for (lVar28 = 0x1c; lVar28 != 0; lVar28 = lVar28 + -1) {
          (pnVar22->m_backend).data._M_elems[0] = (pcVar21->data)._M_elems[0];
          pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar29 * -8 + 4);
          pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar22 + ((ulong)bVar29 * -2 + 1) * 4);
        }
        local_348.val.m_backend.exp = pfVar19[-2];
        local_348.val.m_backend.neg = *(bool *)(pfVar19 + -1);
        local_348.val.m_backend._120_8_ = *(undefined8 *)pfVar19;
        local_6e0.val.m_backend.exp = iVar5;
        local_6e0.val.m_backend.neg = bVar3;
        local_6e0.val.m_backend.fpclass = fVar6;
        local_6e0.val.m_backend.prec_elem = iVar7;
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxCompare::operator()
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_848,compare,&local_6e0,&local_348);
        if (local_848.fpclass == cpp_dec_float_NaN) break;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  (&local_3c8,0,(type *)0x0);
        iVar14 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_848,&local_3c8);
        if (0 < iVar14) break;
        uVar20 = uVar20 - 1;
        pfVar19 = pfVar19 + -0x21;
      } while (lVar16 < (long)uVar20);
    }
    uVar12 = (uint)uVar20;
    if (uVar12 == uVar26) {
      pIVar15 = keys + (int)uVar12;
      iVar13 = pIVar15->idx;
      pnVar22 = &pIVar15->val;
      puVar23 = local_7c8;
      for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
        *puVar23 = (pnVar22->m_backend).data._M_elems[0];
        pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar22 + (ulong)bVar29 * -8 + 4);
        puVar23 = puVar23 + (ulong)bVar29 * -2 + 1;
      }
      iVar5 = (pIVar15->val).m_backend.exp;
      bVar3 = (pIVar15->val).m_backend.neg;
      pIVar15->idx = pIVar1->idx;
      pnVar22 = pnVar25;
      pnVar24 = &pIVar15->val;
      for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
        (pnVar24->m_backend).data._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
        pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar22 + ((ulong)bVar29 * -2 + 1) * 4);
        pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar24 + (ulong)bVar29 * -8 + 4);
      }
      (pIVar15->val).m_backend.exp = (pIVar1->val).m_backend.exp;
      (pIVar15->val).m_backend.neg = (pIVar1->val).m_backend.neg;
      pIVar1->idx = iVar13;
      puVar23 = local_7c8;
      for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
        (pnVar25->m_backend).data._M_elems[0] = *puVar23;
        puVar23 = puVar23 + (ulong)bVar29 * -2 + 1;
        pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar25 + ((ulong)bVar29 * -2 + 1) * 4);
      }
      (pIVar1->val).m_backend.exp = iVar5;
      (pIVar1->val).m_backend.neg = bVar3;
      fVar6 = (pIVar15->val).m_backend.fpclass;
      iVar9 = (pIVar15->val).m_backend.prec_elem;
      iVar7 = (pIVar1->val).m_backend.prec_elem;
      (pIVar15->val).m_backend.fpclass = (pIVar1->val).m_backend.fpclass;
      (pIVar15->val).m_backend.prec_elem = iVar7;
      (pIVar1->val).m_backend.fpclass = fVar6;
      (pIVar1->val).m_backend.prec_elem = iVar9;
      uVar12 = uVar12 - 1;
    }
  }
  else {
    if ((int)uVar18 < (int)uVar26) {
      pfVar19 = &keys[(int)uVar18].val.m_backend.fpclass;
      do {
        local_65c.idx = iVar13;
        puVar23 = local_750;
        pnVar22 = &local_65c.val;
        for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
          (pnVar22->m_backend).data._M_elems[0] = *puVar23;
          puVar23 = puVar23 + (ulong)bVar29 * -2 + 1;
          pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar22 + ((ulong)bVar29 * -2 + 1) * 4);
        }
        local_2c4.idx = pfVar19[-0x1f];
        pcVar21 = (cpp_dec_float<200U,_int,_void> *)(pfVar19 + -0x1e);
        pnVar22 = &local_2c4.val;
        for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
          (pnVar22->m_backend).data._M_elems[0] = (pcVar21->data)._M_elems[0];
          pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar29 * -8 + 4);
          pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar22 + ((ulong)bVar29 * -2 + 1) * 4);
        }
        local_2c4.val.m_backend.exp = pfVar19[-2];
        local_2c4.val.m_backend.neg = *(bool *)(pfVar19 + -1);
        local_2c4.val.m_backend._120_8_ = *(undefined8 *)pfVar19;
        local_65c.val.m_backend.exp = iVar5;
        local_65c.val.m_backend.neg = bVar3;
        local_65c.val.m_backend.fpclass = fVar6;
        local_65c.val.m_backend.prec_elem = iVar7;
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxCompare::operator()
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_848,compare,&local_65c,&local_2c4);
        if (local_848.fpclass == cpp_dec_float_NaN) break;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  (&local_3c8,0,(type *)0x0);
        iVar14 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_848,&local_3c8);
        if (iVar14 < 0) break;
        uVar18 = uVar18 + 1;
        pfVar19 = pfVar19 + 0x21;
      } while (uVar26 != uVar18);
    }
    if (uVar18 == start) {
      pIVar15 = keys + (int)uVar18;
      iVar13 = pIVar15->idx;
      pnVar22 = &pIVar15->val;
      puVar23 = local_7c8;
      for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
        *puVar23 = (pnVar22->m_backend).data._M_elems[0];
        pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar22 + (ulong)bVar29 * -8 + 4);
        puVar23 = puVar23 + (ulong)bVar29 * -2 + 1;
      }
      iVar5 = (pIVar15->val).m_backend.exp;
      bVar3 = (pIVar15->val).m_backend.neg;
      pIVar15->idx = pIVar1->idx;
      pnVar22 = pnVar25;
      pnVar24 = &pIVar15->val;
      for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
        (pnVar24->m_backend).data._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
        pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar22 + ((ulong)bVar29 * -2 + 1) * 4);
        pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar24 + (ulong)bVar29 * -8 + 4);
      }
      (pIVar15->val).m_backend.exp = (pIVar1->val).m_backend.exp;
      (pIVar15->val).m_backend.neg = (pIVar1->val).m_backend.neg;
      pIVar1->idx = iVar13;
      puVar23 = local_7c8;
      for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
        (pnVar25->m_backend).data._M_elems[0] = *puVar23;
        puVar23 = puVar23 + (ulong)bVar29 * -2 + 1;
        pnVar25 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar25 + ((ulong)bVar29 * -2 + 1) * 4);
      }
      (pIVar1->val).m_backend.exp = iVar5;
      (pIVar1->val).m_backend.neg = bVar3;
      fVar6 = (pIVar15->val).m_backend.fpclass;
      iVar9 = (pIVar15->val).m_backend.prec_elem;
      iVar7 = (pIVar1->val).m_backend.prec_elem;
      (pIVar15->val).m_backend.fpclass = (pIVar1->val).m_backend.fpclass;
      (pIVar15->val).m_backend.prec_elem = iVar7;
      (pIVar1->val).m_backend.fpclass = fVar6;
      (pIVar1->val).m_backend.prec_elem = iVar9;
      uVar18 = uVar18 + 1;
    }
  }
  if ((int)(uVar26 - uVar18) < (int)(uVar12 - start)) {
    bVar3 = (int)uVar26 <= (int)uVar18;
    uVar27 = uVar12;
    uVar12 = uVar26;
    uVar26 = uVar18;
    uVar18 = start;
    if (bVar3) goto LAB_005ac9bc;
  }
  else {
    bVar3 = (int)uVar12 <= start;
    uVar27 = uVar26;
    uVar26 = start;
    start = uVar18;
    if (bVar3) goto LAB_005ac9bc;
  }
  SPxQuicksort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
            (keys,uVar12 + 1,compare,uVar26,(bool)(~type & 1));
  start = uVar18;
LAB_005ac9bc:
  uVar26 = uVar27;
  type = (bool)(type ^ 1);
  uVar12 = uVar26 - start;
  if ((int)uVar12 < 0x19) goto LAB_005ac9dc;
  goto LAB_005abfd5;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}